

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O3

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer::
~ExplicitProducer(ExplicitProducer *this)

{
  FreeList<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar1;
  atomic<unsigned_int> *paVar2;
  undefined8 *puVar3;
  __int_type_conflict1 _Var4;
  long *plVar5;
  ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *pCVar6;
  void *pvVar7;
  void *__ptr;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  __pointer_type pBVar11;
  __pointer_type pBVar12;
  Block *__ptr_00;
  Block *pBVar13;
  Block *pBVar14;
  bool bVar15;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_001e1520;
  pBVar13 = (this->super_ProducerBase).tailBlock;
  if (pBVar13 != (Block *)0x0) {
    if (((this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) == 0)
    {
      pBVar14 = (Block *)0x0;
    }
    else {
      uVar8 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar9 = uVar8 & this->pr_blockIndexSize - 1;
        uVar8 = uVar9 + 1;
      } while (0x8000000000000000 <
               (this->pr_blockIndexEntries[uVar9].base -
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i) + 0x20)
      ;
      pBVar14 = this->pr_blockIndexEntries[uVar9].block;
    }
    do {
      pBVar13 = pBVar13->next;
      if ((pBVar13->emptyFlags[0]._M_base._M_i & 1U) == 0) {
LAB_001175b6:
        if (pBVar13 == pBVar14) {
          uVar8 = (ulong)((uint)(this->super_ProducerBase).headIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        else {
          uVar8 = 0;
        }
        if (((this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) ==
            0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = (ulong)((uint)(this->super_ProducerBase).tailIndex.
                                super___atomic_base<unsigned_long>._M_i & 0x1f);
        }
        do {
          if ((uVar9 == uVar8) && (pBVar13 == (this->super_ProducerBase).tailBlock)) break;
          puVar3 = (undefined8 *)((long)&pBVar13->field_0 + (ulong)((uint)uVar8 & 0x1f) * 0x28);
          plVar10 = puVar3 + 2;
          plVar5 = (long *)*puVar3;
          if (plVar5 != plVar10) {
            operator_delete(plVar5,*plVar10 + 1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x20);
      }
      else {
        uVar8 = 0;
        do {
          uVar9 = uVar8;
          if (uVar9 == 0x1f) goto LAB_0011761c;
          uVar8 = uVar9 + 1;
        } while ((pBVar13->emptyFlags[uVar9 + 1]._M_base._M_i & 1U) != 0);
        if (uVar9 < 0x1f) goto LAB_001175b6;
      }
LAB_0011761c:
      __ptr_00 = (this->super_ProducerBase).tailBlock;
    } while (pBVar13 != __ptr_00);
    if (pBVar13 != (Block *)0x0) {
      do {
        pBVar13 = __ptr_00->next;
        if (__ptr_00->dynamicallyAllocated == true) {
          free(__ptr_00);
        }
        else {
          pCVar6 = (this->super_ProducerBase).parent;
          LOCK();
          paVar2 = &__ptr_00->freeListRefs;
          _Var4 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
          UNLOCK();
          if (_Var4 == 0) {
            pBVar11 = (pCVar6->freeList).freeListHead._M_b._M_p;
            do {
              (__ptr_00->freeListNext)._M_b._M_p = pBVar11;
              (__ptr_00->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
              pFVar1 = &pCVar6->freeList;
              LOCK();
              pBVar12 = (pFVar1->freeListHead)._M_b._M_p;
              bVar15 = pBVar11 == pBVar12;
              if (bVar15) {
                (pFVar1->freeListHead)._M_b._M_p = __ptr_00;
                pBVar12 = pBVar11;
              }
              UNLOCK();
              if (bVar15) break;
              LOCK();
              paVar2 = &__ptr_00->freeListRefs;
              _Var4 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
              (paVar2->super___atomic_base<unsigned_int>)._M_i =
                   (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
              UNLOCK();
              pBVar11 = pBVar12;
            } while (_Var4 == 1);
          }
        }
        __ptr_00 = pBVar13;
      } while (pBVar13 != (this->super_ProducerBase).tailBlock);
    }
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar7 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar7;
  }
  return;
}

Assistant:

~ExplicitProducer()
        {
            // Destruct any elements not yet dequeued.
            // Since we're in the destructor, we can assume all elements
            // are either completely dequeued or completely not (no halfways).
            if (this->tailBlock != nullptr) {       // Note this means there must be a block index too
                // First find the block that's partially dequeued, if any
                Block* halfDequeuedBlock = nullptr;
                if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
                    // The head's not on a block boundary, meaning a block somewhere is partially dequeued
                    // (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
                    size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
                    while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
                        i = (i + 1) & (pr_blockIndexSize - 1);
                    }
                    assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
                    halfDequeuedBlock = pr_blockIndexEntries[i].block;
                }
                
                // Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
                auto block = this->tailBlock;
                do {
                    block = block->next;
                    if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
                        continue;
                    }
                    
                    size_t i = 0;   // Offset into block
                    if (block == halfDequeuedBlock) {
                        i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
                    }
                    
                    // Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
                    auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
                    while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
                        (*block)[i++]->~T();
                    }
                } while (block != this->tailBlock);
            }
            
            // Destroy all blocks that we own
            if (this->tailBlock != nullptr) {
                auto block = this->tailBlock;
                do {
                    auto nextBlock = block->next;
                    if (block->dynamicallyAllocated) {
                        destroy(block);
                    }
                    else {
                        this->parent->add_block_to_free_list(block);
                    }
                    block = nextBlock;
                } while (block != this->tailBlock);
            }
            
            // Destroy the block indices
            auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
            while (header != nullptr) {
                auto prev = static_cast<BlockIndexHeader*>(header->prev);
                header->~BlockIndexHeader();
                (Traits::free)(header);
                header = prev;
            }
        }